

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O2

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::collect_changes
          (DynamicPartialIndex *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *sv,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *graph,vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *reverse_graph,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  value_type vVar1;
  pointer puVar2;
  size_type sVar3;
  bool bVar4;
  reference pvVar5;
  reference pvVar6;
  const_reference pvVar7;
  DynamicPartialIndex *pDVar8;
  uint *s;
  pointer puVar9;
  
  this->back_ = 0;
  this->front_ = 0;
  puVar2 = (sv->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar9 = (sv->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar9 != puVar2; puVar9 = puVar9 + 1) {
    pDVar8 = (DynamicPartialIndex *)dist;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar9);
    if (*pvVar5 != '\0') {
      bVar4 = has_parent(pDVar8,*puVar9,reverse_graph,dist);
      if (!bVar4) {
        vVar1 = *puVar9;
        sVar3 = this->back_;
        this->back_ = sVar3 + 1;
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this->queue_,sVar3);
        *pvVar6 = vVar1;
        pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar9)
        ;
        *pvVar5 = '?';
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this->updated_,puVar9);
      }
    }
  }
  while (sVar3 = this->front_, this->back_ != sVar3) {
    this->front_ = sVar3 + 1;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this->queue_,sVar3);
    pvVar7 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::at(graph,(ulong)*pvVar6);
    puVar2 = (pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar9 = (pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start; puVar9 != puVar2; puVar9 = puVar9 + 1) {
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar9);
      if (*pvVar5 != '?') {
        pDVar8 = (DynamicPartialIndex *)dist;
        pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar9)
        ;
        if (*pvVar5 != '\0') {
          bVar4 = has_parent(pDVar8,*puVar9,reverse_graph,dist);
          if (!bVar4) {
            vVar1 = *puVar9;
            sVar3 = this->back_;
            this->back_ = sVar3 + 1;
            pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                               (this->queue_,sVar3);
            *pvVar6 = vVar1;
            pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               (dist,(ulong)*puVar9);
            *pvVar5 = '?';
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (this->updated_,puVar9);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void DynamicScalableKReach::DynamicPartialIndex::collect_changes(const std::vector<vertex_t> &sv,
                                                                 const std::vector<std::vector<vertex_t>> &graph,
                                                                 const std::vector<std::vector<vertex_t>> &reverse_graph,
                                                                 std::vector<distance_t> &dist) {
    back_ = 0;
    front_ = 0;
    for (const auto &s : sv) {
        if (dist.at(s) > 0 && !has_parent(s, reverse_graph, dist)) {
            queue_.at(back_++) = s;
            dist.at(s) = INF8;
            updated_.push_back(s);
        }
    }
    while (back_ != front_) {
        auto cur = queue_.at(front_++);
        for (const auto &nxt : graph.at(cur)) {
            if (dist.at(nxt) != INF8 && dist.at(nxt) > 0 && !has_parent(nxt, reverse_graph, dist)) {
                queue_.at(back_++) = nxt;
                dist.at(nxt) = INF8;
                updated_.push_back(nxt);
            }
        }
    }
}